

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::handleIfDefDirective(Preprocessor *this,Token directive,bool inverted)

{
  size_type sVar1;
  bool bVar2;
  ConditionalDirectiveExpressionSyntax *expr;
  Trivia TVar3;
  BranchEntry local_48;
  
  expr = parseConditionalExprTop(this);
  sVar1 = (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.len;
  if ((sVar1 == 0) ||
     ((this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.data_
      [sVar1 - 1].currentActive == true)) {
    bVar2 = evalConditionalExpr(this,expr);
    bVar2 = bVar2 != inverted;
  }
  else {
    bVar2 = false;
  }
  local_48.hasElse = false;
  local_48.directive._0_8_ = directive._0_8_;
  local_48.directive.info = directive.info;
  local_48.anyTaken = bVar2;
  local_48.currentActive = bVar2;
  SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::
  emplace_back<slang::parsing::Preprocessor::BranchEntry>
            (&(this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>,
             &local_48);
  TVar3 = parseBranchDirective(this,directive,expr,bVar2);
  TVar3._8_8_ = TVar3._8_8_ & 0xffffffffffff;
  return TVar3;
}

Assistant:

Trivia Preprocessor::handleIfDefDirective(Token directive, bool inverted) {
    auto& expr = parseConditionalExprTop();
    bool take = false;
    if (branchStack.empty() || branchStack.back().currentActive) {
        // decide whether the branch is taken or skipped
        take = evalConditionalExpr(expr);
        if (inverted)
            take = !take;
    }

    branchStack.emplace_back(BranchEntry(directive, take));

    return parseBranchDirective(directive, &expr, take);
}